

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

archive_entry * archive_entry_new2(archive *a)

{
  archive_entry *paVar1;
  
  paVar1 = (archive_entry *)calloc(1,0x438);
  if (paVar1 != (archive_entry *)0x0) {
    paVar1->archive = a;
  }
  return paVar1;
}

Assistant:

struct archive_entry *
archive_entry_new2(struct archive *a)
{
	struct archive_entry *entry;

	entry = (struct archive_entry *)malloc(sizeof(*entry));
	if (entry == NULL)
		return (NULL);
	memset(entry, 0, sizeof(*entry));
	entry->archive = a;
	return (entry);
}